

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O0

int enet_protocol_send_outgoing_commands(ENetHost *host,ENetEvent *event,int checkForTimeouts)

{
  long lVar1;
  int iVar2;
  ENetPeer *pEVar3;
  int in_EDX;
  ENetAddress *in_RSI;
  long in_RDI;
  ENetHost *unaff_retaddr;
  enet_uint32 *checksum;
  size_t compressedSize;
  size_t originalSize;
  enet_uint32 packetLoss;
  int i;
  size_t shouldCompress;
  int sentLength;
  ENetPeer *currentPeer;
  ENetProtocolHeader *header;
  enet_uint8 headerData [10];
  int local_74;
  uint in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  ENetPeer *in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb0;
  int iVar4;
  ENetPeer *peer;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  ENetHost *host_00;
  size_t in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  peer = (ENetPeer *)0x0;
  *(undefined4 *)(in_RDI + 0x58) = 1;
  do {
    if (*(int *)(in_RDI + 0x58) == 0) {
      return 0;
    }
    *(undefined4 *)(in_RDI + 0x58) = 0;
    for (iVar4 = 0; (ulong)(long)iVar4 < *(ulong *)(in_RDI + 0x30); iVar4 = iVar4 + 1) {
      host_00 = *(ENetHost **)(*(long *)(in_RDI + 0x28) + (long)iVar4 * 8);
      if (((int)host_00->channelLimit != 0) && ((int)host_00->channelLimit != 9)) {
        *(undefined4 *)(in_RDI + 0x68) = 0;
        *(undefined8 *)(in_RDI + 0x6b0) = 0;
        *(undefined8 *)(in_RDI + 0xac8) = 1;
        *(undefined8 *)(in_RDI + 0x60) = 6;
        if (*(undefined1 **)((long)host_00->commands + 0x74) !=
            (undefined1 *)((long)host_00->commands + 0x74)) {
          enet_protocol_send_acknowledgements
                    ((ENetHost *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8
                    );
        }
        if ((((in_EDX == 0) ||
             (*(undefined1 **)((long)host_00->commands + 0x84) ==
              (undefined1 *)((long)host_00->commands + 0x84))) ||
            (86399999 < *(int *)(in_RDI + 0x40) - host_00->commands[0].connect.outgoingPeerID)) ||
           (iVar2 = enet_protocol_check_timeouts
                              (host_00,(ENetPeer *)
                                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                               ,(ENetEvent *)peer), iVar2 != 1)) {
          if (((*(undefined1 **)((long)host_00->commands + 0xa4) ==
                (undefined1 *)((long)host_00->commands + 0xa4)) ||
              (iVar2 = enet_protocol_send_reliable_outgoing_commands
                                 (unaff_retaddr,
                                  (ENetPeer *)
                                  CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)),
              iVar2 != 0)) &&
             (*(undefined1 **)((long)host_00->commands + 0x84) ==
              (undefined1 *)((long)host_00->commands + 0x84))) {
            if ((uint)(*(int *)(in_RDI + 0x40) - *(int *)host_00->commands) < 86400000) {
              in_stack_ffffffffffffff94 = *(int *)(in_RDI + 0x40) - *(int *)host_00->commands;
            }
            else {
              in_stack_ffffffffffffff94 = (int)host_00->commands[0].header - *(int *)(in_RDI + 0x40)
              ;
            }
            if ((*(uint *)((long)host_00->commands + 0x3c) <= in_stack_ffffffffffffff94) &&
               (3 < (ulong)(uint)*(ENetProtocolCommandHeader *)(host_00->commands + 2) -
                    *(long *)(in_RDI + 0x60))) {
              enet_peer_ping((ENetPeer *)
                             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
              enet_protocol_send_reliable_outgoing_commands
                        (unaff_retaddr,
                         (ENetPeer *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
            }
          }
          if (*(undefined1 **)((long)host_00->commands + 0xb4) !=
              (undefined1 *)((long)host_00->commands + 0xb4)) {
            enet_protocol_send_unreliable_outgoing_commands
                      ((ENetHost *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       peer);
          }
          if (*(long *)(in_RDI + 0x6b0) != 0) {
            if (*(int *)((long)&host_00->commands[0].connect.mtu + 2) == 0) {
              *(undefined4 *)((long)&host_00->commands[0].connect.mtu + 2) =
                   *(undefined4 *)(in_RDI + 0x40);
            }
            else {
              if ((uint)(*(int *)(in_RDI + 0x40) -
                        *(int *)((long)&host_00->commands[0].connect.mtu + 2)) < 86400000) {
                in_stack_ffffffffffffff90 =
                     *(int *)(in_RDI + 0x40) - *(int *)((long)&host_00->commands[0].connect.mtu + 2)
                ;
              }
              else {
                in_stack_ffffffffffffff90 =
                     *(int *)((long)&host_00->commands[0].connect.mtu + 2) - *(int *)(in_RDI + 0x40)
                ;
              }
              if ((9999 < in_stack_ffffffffffffff90) &&
                 (*(int *)((long)&host_00->commands[0].connect.windowSize + 2) != 0)) {
                in_stack_ffffffffffffffb0 =
                     (uint)(*(int *)((long)&host_00->commands[0].connect.channelCount + 2) << 0x10)
                     / *(uint *)((long)&host_00->commands[0].connect.windowSize + 2);
                *(uint *)((long)&host_00->commands[0].connect.outgoingBandwidth + 2) =
                     *(int *)((long)&host_00->commands[0].connect.outgoingBandwidth + 2) -
                     (*(uint *)((long)&host_00->commands[0].connect.outgoingBandwidth + 2) >> 2);
                if (in_stack_ffffffffffffffb0 <
                    *(uint *)((long)&host_00->commands[0].connect.incomingBandwidth + 2)) {
                  *(uint *)((long)&host_00->commands[0].connect.incomingBandwidth + 2) =
                       *(int *)((long)&host_00->commands[0].connect.incomingBandwidth + 2) -
                       (*(int *)((long)&host_00->commands[0].connect.incomingBandwidth + 2) -
                        in_stack_ffffffffffffffb0 >> 3);
                  *(uint *)((long)&host_00->commands[0].connect.outgoingBandwidth + 2) =
                       (*(int *)((long)&host_00->commands[0].connect.incomingBandwidth + 2) -
                        in_stack_ffffffffffffffb0 >> 2) +
                       *(int *)((long)&host_00->commands[0].connect.outgoingBandwidth + 2);
                }
                else {
                  *(uint *)((long)&host_00->commands[0].connect.incomingBandwidth + 2) =
                       (in_stack_ffffffffffffffb0 -
                        *(int *)((long)&host_00->commands[0].connect.incomingBandwidth + 2) >> 3) +
                       *(int *)((long)&host_00->commands[0].connect.incomingBandwidth + 2);
                  *(uint *)((long)&host_00->commands[0].connect.outgoingBandwidth + 2) =
                       (in_stack_ffffffffffffffb0 -
                        *(int *)((long)&host_00->commands[0].connect.incomingBandwidth + 2) >> 2) +
                       *(int *)((long)&host_00->commands[0].connect.outgoingBandwidth + 2);
                }
                *(undefined4 *)((long)&host_00->commands[0].connect.mtu + 2) =
                     *(undefined4 *)(in_RDI + 0x40);
                *(undefined4 *)((long)&host_00->commands[0].connect.windowSize + 2) = 0;
                *(undefined4 *)((long)&host_00->commands[0].connect.channelCount + 2) = 0;
              }
            }
            *(undefined1 **)(in_RDI + 0x6b8) = &stack0xffffffffffffffda;
            if ((*(uint *)(in_RDI + 0x68) & 0x8000000) == 0) {
              *(undefined8 *)(in_RDI + 0x6c0) = 4;
            }
            else {
              htons((uint16_t)*(undefined4 *)(in_RDI + 0x40));
              *(undefined8 *)(in_RDI + 0x6c0) = 6;
            }
            peer = (ENetPeer *)0x0;
            if ((*(long *)(in_RDI + 0xad8) != 0) && (*(long *)(in_RDI + 0xae0) != 0)) {
              in_stack_ffffffffffffffa8 = (ENetPeer *)(*(long *)(in_RDI + 0x60) + -6);
              pEVar3 = (ENetPeer *)
                       (**(code **)(in_RDI + 0xae0))
                                 (*(undefined8 *)(in_RDI + 0xad8),in_RDI + 0x6c8,
                                  *(long *)(in_RDI + 0xac8) + -1,in_stack_ffffffffffffffa8,
                                  in_RDI + 0x1af8,in_stack_ffffffffffffffa8);
              if ((pEVar3 != (ENetPeer *)0x0) && (pEVar3 < in_stack_ffffffffffffffa8)) {
                *(uint *)(in_RDI + 0x68) = *(uint *)(in_RDI + 0x68) | 0x4000000;
                peer = pEVar3;
              }
            }
            if (host_00->mtu < 0xffffff) {
              *(uint *)(in_RDI + 0x68) =
                   (uint)(byte)host_00->field_0x24 << 0x18 | *(uint *)(in_RDI + 0x68);
            }
            htonl(host_00->mtu | *(uint *)(in_RDI + 0x68));
            if (*(long *)(in_RDI + 0xad0) != 0) {
              lVar1 = *(long *)(in_RDI + 0x6c0);
              if (host_00->mtu < 0xffffff) {
                local_74 = host_00->recalculateBandwidthLimits;
              }
              else {
                local_74 = 0;
              }
              *(int *)(&stack0xffffffffffffffda + lVar1) = local_74;
              *(long *)(in_RDI + 0x6c0) = *(long *)(in_RDI + 0x6c0) + 4;
              iVar2 = (**(code **)(in_RDI + 0xad0))(in_RDI + 0x6b8,*(undefined8 *)(in_RDI + 0xac8));
              *(int *)(&stack0xffffffffffffffda + lVar1) = iVar2;
            }
            if (peer != (ENetPeer *)0x0) {
              *(long *)(in_RDI + 0x6c8) = in_RDI + 0x1af8;
              *(ENetPeer **)(in_RDI + 0x6d0) = peer;
              *(undefined8 *)(in_RDI + 0xac8) = 2;
            }
            host_00->headerFlags = *(enet_uint32 *)(in_RDI + 0x40);
            in_stack_ffffffffffffffc4 =
                 enet_socket_send((ENetSocket)in_RDI,in_RSI,
                                  (ENetBuffer *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                                  in_stack_ffffffffffffffd8);
            enet_protocol_remove_sent_unreliable_commands
                      ((ENetPeer *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
            if (in_stack_ffffffffffffffc4 < 0) {
              return -1;
            }
            *(int *)(in_RDI + 0x2b10) = in_stack_ffffffffffffffc4 + *(int *)(in_RDI + 0x2b10);
            *(int *)(in_RDI + 0x2b14) = *(int *)(in_RDI + 0x2b14) + 1;
          }
        }
        else if ((in_RSI != (ENetAddress *)0x0) && (in_RSI->host != 0)) {
          return 1;
        }
      }
    }
  } while( true );
}

Assistant:

static int
enet_protocol_send_outgoing_commands (ENetHost * host, ENetEvent * event, int checkForTimeouts)
{
    enet_uint8 headerData [sizeof (ENetProtocolHeader) + sizeof (enet_uint32)];
    ENetProtocolHeader * header = (ENetProtocolHeader *) headerData;
    ENetPeer * currentPeer;
    int sentLength;
    size_t shouldCompress = 0;
    int i;

    host -> continueSending = 1;

    while (host -> continueSending)
    for (host -> continueSending = 0,
	     i = 0; i < host -> peerCount; i++ )
    {
	currentPeer = host -> peer_list[i];
        if (currentPeer -> state == ENET_PEER_STATE_DISCONNECTED ||
            currentPeer -> state == ENET_PEER_STATE_ZOMBIE)
          continue;

        host -> headerFlags = 0;
        host -> commandCount = 0;
        host -> bufferCount = 1;
        host -> packetSize = sizeof (ENetProtocolHeader);

        if (! enet_list_empty (& currentPeer -> acknowledgements))
          enet_protocol_send_acknowledgements (host, currentPeer);

        if (checkForTimeouts != 0 &&
            ! enet_list_empty (& currentPeer -> sentReliableCommands) &&
            ENET_TIME_GREATER_EQUAL (host -> serviceTime, currentPeer -> nextTimeout) &&
            enet_protocol_check_timeouts (host, currentPeer, event) == 1)
        {
            if (event != NULL && event -> type != ENET_EVENT_TYPE_NONE)
              return 1;
            else
              continue;
        }

        if ((enet_list_empty (& currentPeer -> outgoingReliableCommands) ||
              enet_protocol_send_reliable_outgoing_commands (host, currentPeer)) &&
            enet_list_empty (& currentPeer -> sentReliableCommands) &&
            ENET_TIME_DIFFERENCE (host -> serviceTime, currentPeer -> lastReceiveTime) >= currentPeer -> pingInterval &&
            currentPeer -> mtu - host -> packetSize >= sizeof (ENetProtocolPing))
        { 
            enet_peer_ping (currentPeer);
            enet_protocol_send_reliable_outgoing_commands (host, currentPeer);
        }
                      
        if (! enet_list_empty (& currentPeer -> outgoingUnreliableCommands))
          enet_protocol_send_unreliable_outgoing_commands (host, currentPeer);

        if (host -> commandCount == 0)
          continue;

        if (currentPeer -> packetLossEpoch == 0)
          currentPeer -> packetLossEpoch = host -> serviceTime;
        else
        if (ENET_TIME_DIFFERENCE (host -> serviceTime, currentPeer -> packetLossEpoch) >= ENET_PEER_PACKET_LOSS_INTERVAL &&
            currentPeer -> packetsSent > 0)
        {
           enet_uint32 packetLoss = currentPeer -> packetsLost * ENET_PEER_PACKET_LOSS_SCALE / currentPeer -> packetsSent;

#ifdef ENET_DEBUG
           printf ("peer %u: %f%%+-%f%% packet loss, %u+-%u ms round trip time, %f%% throttle, %u/%u outgoing, %u/%u incoming\n", currentPeer -> incomingPeerID, currentPeer -> packetLoss / (float) ENET_PEER_PACKET_LOSS_SCALE, currentPeer -> packetLossVariance / (float) ENET_PEER_PACKET_LOSS_SCALE, currentPeer -> roundTripTime, currentPeer -> roundTripTimeVariance, currentPeer -> packetThrottle / (float) ENET_PEER_PACKET_THROTTLE_SCALE, enet_list_size (& currentPeer -> outgoingReliableCommands), enet_list_size (& currentPeer -> outgoingUnreliableCommands), currentPeer -> channels != NULL ? enet_list_size (& currentPeer -> channels -> incomingReliableCommands) : 0, currentPeer -> channels != NULL ? enet_list_size (& currentPeer -> channels -> incomingUnreliableCommands) : 0);
#endif
          
           currentPeer -> packetLossVariance -= currentPeer -> packetLossVariance / 4;

           if (packetLoss >= currentPeer -> packetLoss)
           {
              currentPeer -> packetLoss += (packetLoss - currentPeer -> packetLoss) / 8;
              currentPeer -> packetLossVariance += (packetLoss - currentPeer -> packetLoss) / 4;
           }
           else
           {
              currentPeer -> packetLoss -= (currentPeer -> packetLoss - packetLoss) / 8;
              currentPeer -> packetLossVariance += (currentPeer -> packetLoss - packetLoss) / 4;
           }

           currentPeer -> packetLossEpoch = host -> serviceTime;
           currentPeer -> packetsSent = 0;
           currentPeer -> packetsLost = 0;
        }

        host -> buffers -> data = headerData;
        if (host -> headerFlags & ENET_PROTOCOL_HEADER_FLAG_SENT_TIME)
        {
            header -> sentTime = ENET_HOST_TO_NET_16 (host -> serviceTime & 0xFFFF);

            host -> buffers -> dataLength = sizeof (ENetProtocolHeader);
        }
        else
          host -> buffers -> dataLength = (size_t) & ((ENetProtocolHeader *) 0) -> sentTime;

        shouldCompress = 0;
        if (host -> compressor.context != NULL && host -> compressor.compress != NULL)
        {
            size_t originalSize = host -> packetSize - sizeof(ENetProtocolHeader),
                   compressedSize = host -> compressor.compress (host -> compressor.context,
                                        & host -> buffers [1], host -> bufferCount - 1,
                                        originalSize,
                                        host -> packetData [1],
                                        originalSize);
            if (compressedSize > 0 && compressedSize < originalSize)
            {
                host -> headerFlags |= ENET_PROTOCOL_HEADER_FLAG_COMPRESSED;
                shouldCompress = compressedSize;
#ifdef ENET_DEBUG_COMPRESS
                printf ("peer %u: compressed %u -> %u (%u%%)\n", currentPeer -> incomingPeerID, originalSize, compressedSize, (compressedSize * 100) / originalSize);
#endif
            }
        }

        if (currentPeer -> outgoingPeerID < ENET_PROTOCOL_MAXIMUM_PEER_ID)
          host -> headerFlags |= currentPeer -> outgoingSessionID << ENET_PROTOCOL_HEADER_SESSION_SHIFT;
        header -> peerID = ENET_HOST_TO_NET_32 (currentPeer -> outgoingPeerID | host -> headerFlags);
        if (host -> checksum != NULL)
        {
            enet_uint32 * checksum = (enet_uint32 *) & headerData [host -> buffers -> dataLength];
            * checksum = currentPeer -> outgoingPeerID < ENET_PROTOCOL_MAXIMUM_PEER_ID ? currentPeer -> connectID : 0;
            host -> buffers -> dataLength += sizeof (enet_uint32);
            * checksum = host -> checksum (host -> buffers, host -> bufferCount);
        }

        if (shouldCompress > 0)
        {
            host -> buffers [1].data = host -> packetData [1];
            host -> buffers [1].dataLength = shouldCompress;
            host -> bufferCount = 2;
        }

        currentPeer -> lastSendTime = host -> serviceTime;

        sentLength = enet_socket_send (host -> socket, & currentPeer -> address, host -> buffers, host -> bufferCount);

        enet_protocol_remove_sent_unreliable_commands (currentPeer);

        if (sentLength < 0)
          return -1;

        host -> totalSentData += sentLength;
        host -> totalSentPackets ++;
    }
   
    return 0;
}